

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O3

void __thiscall xercesc_4_0::TraverseSchema::traverseImport(TraverseSchema *this,DOMElement *elem)

{
  SchemaInfo *pSVar1;
  SchemaInfo *toRestore;
  RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *pRVar2;
  NamespaceScopeManager nsMgr;
  NamespaceScopeManager local_28;
  
  pSVar1 = this->fSchemaInfo;
  if (elem == (DOMElement *)0x0) {
    local_28.fScopeAdded = false;
  }
  else {
    local_28.fScopeAdded = retrieveNamespaceMapping(this,elem);
  }
  pRVar2 = this->fPreprocessedNodes->fBucketList
           [(ulong)elem % this->fPreprocessedNodes->fHashModulus];
  do {
    local_28.fSchemaInfo = pSVar1;
    if (pRVar2 == (RefHashTableBucketElem<xercesc_4_0::SchemaInfo> *)0x0) {
LAB_00320f68:
      NamespaceScopeManager::~NamespaceScopeManager(&local_28);
      return;
    }
    if ((DOMElement *)pRVar2->fKey == elem) {
      pSVar1 = pRVar2->fData;
      if (pSVar1 != (SchemaInfo *)0x0) {
        toRestore = this->fSchemaInfo;
        restoreSchemaInfo(this,pSVar1,IMPORT,0xfffffffe);
        doTraverseSchema(this,pSVar1->fSchemaRootElement);
        restoreSchemaInfo(this,toRestore,IMPORT,0xfffffffe);
      }
      goto LAB_00320f68;
    }
    pRVar2 = pRVar2->fNext;
  } while( true );
}

Assistant:

void TraverseSchema::traverseImport(const DOMElement* const elem) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    SchemaInfo* importInfo = fPreprocessedNodes->get(elem);

    if (importInfo) {

        // --------------------------------------------------------
        // Traverse new schema
        // --------------------------------------------------------
        SchemaInfo* saveInfo = fSchemaInfo;

        restoreSchemaInfo(importInfo, SchemaInfo::IMPORT);
        doTraverseSchema(importInfo->getRoot());

        // --------------------------------------------------------
        // Restore old schema information
        // --------------------------------------------------------
        restoreSchemaInfo(saveInfo, SchemaInfo::IMPORT);
    }
}